

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O0

Fxch_Man_t * Fxch_ManStart(Vec_Wec_t *vCubes,Vec_Wec_t *vLits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Fxch_Man_t *p_00;
  Vec_Int_t *p_01;
  Fxch_Obj_t *pFVar4;
  Fxch_Man_t *p;
  int LogSize;
  int i;
  Vec_Int_t *vCube;
  Vec_Wec_t *vLits_local;
  Vec_Wec_t *vCubes_local;
  
  p_00 = (Fxch_Man_t *)calloc(1,0xe8);
  iVar1 = vCubes->nSize;
  (p_00->vCubes).nCap = vCubes->nCap;
  (p_00->vCubes).nSize = iVar1;
  (p_00->vCubes).pArray = vCubes->pArray;
  iVar1 = vLits->nSize;
  (p_00->vLits).nCap = vLits->nCap;
  (p_00->vLits).nSize = iVar1;
  (p_00->vLits).pArray = vLits->pArray;
  iVar1 = Vec_WecSize(vLits);
  p_00->nVars = iVar1 / 2;
  p_00->nLits = 0;
  Gia_ManRandom(1);
  Vec_IntGrow(&p_00->vRands,p_00->nVars << 1);
  for (p._4_4_ = 0; SBORROW4(p._4_4_,p_00->nVars * 2) != p._4_4_ + p_00->nVars * -2 < 0;
      p._4_4_ = p._4_4_ + 1) {
    uVar2 = Gia_ManRandom(0);
    Vec_IntPush(&p_00->vRands,uVar2 & 0x3ffffff);
  }
  iVar1 = Vec_WecSize((Vec_Wec_t *)p_00);
  Vec_IntGrow(&p_00->vCubeLinks,iVar1);
  for (p._4_4_ = 0; iVar1 = Vec_WecSize(vCubes), p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
    p_01 = Vec_WecEntry(vCubes,p._4_4_);
    Vec_IntPush(&p_00->vCubeLinks,p_00->nLits + 1);
    iVar1 = Vec_IntSize(p_01);
    p_00->nLits = iVar1 + p_00->nLits;
  }
  iVar1 = Vec_IntSize(&p_00->vCubeLinks);
  iVar3 = Vec_WecSize((Vec_Wec_t *)p_00);
  if (iVar1 != iVar3) {
    __assert_fail("Vec_IntSize(&p->vCubeLinks) == Vec_WecSize(&p->vCubes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0xb8,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
  }
  iVar1 = Abc_Base2Log(p_00->nLits + 1);
  if (0x1a < iVar1) {
    __assert_fail("LogSize <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0xbb,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
  }
  p_00->SizeMask = (1 << ((byte)iVar1 & 0x1f)) + -1;
  pFVar4 = (Fxch_Obj_t *)calloc((long)(p_00->SizeMask + 1),0x10);
  p_00->pBins = pFVar4;
  if (p_00->SizeMask + 1 <= p_00->nLits + 1) {
    __assert_fail("p->nLits+1 < p->SizeMask+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0xbe,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
  }
  Vec_FltGrow(&p_00->vWeights,1000);
  Vec_FltPush(&p_00->vWeights,-1.0);
  Vec_WecGrow(&p_00->vPairs,1000);
  Vec_WecPushLevel(&p_00->vPairs);
  Vec_WrdGrow(&p_00->vDivs,p_00->nVars + 1000);
  Vec_WrdFill(&p_00->vDivs,p_00->nVars,0);
  return p_00;
}

Assistant:

Fxch_Man_t * Fxch_ManStart( Vec_Wec_t * vCubes, Vec_Wec_t * vLits )
{
    Vec_Int_t * vCube;  int i, LogSize;
    Fxch_Man_t * p = ABC_CALLOC( Fxch_Man_t, 1 );
    p->vCubes = *vCubes;
    p->vLits  = *vLits;
    p->nVars  = Vec_WecSize(vLits)/2;
    p->nLits  = 0;
    // random numbers
    Gia_ManRandom( 1 );
    Vec_IntGrow( &p->vRands, 2*p->nVars );
    for ( i = 0; i < 2*p->nVars; i++ )
        Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF ); // assert( LogSize <= 26 );
    // create cube links
    Vec_IntGrow( &p->vCubeLinks, Vec_WecSize(&p->vCubes) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        Vec_IntPush( &p->vCubeLinks, p->nLits+1 );
        p->nLits += Vec_IntSize(vCube);
    }
    assert( Vec_IntSize(&p->vCubeLinks) == Vec_WecSize(&p->vCubes) );
    // create table
    LogSize = Abc_Base2Log( p->nLits+1 );
    assert( LogSize <= 26 );
    p->SizeMask = (1 << LogSize) - 1;
    p->pBins = ABC_CALLOC( Fxch_Obj_t, p->SizeMask + 1 );
    assert( p->nLits+1 < p->SizeMask+1 );
    // divisor weights and cube pairs
    Vec_FltGrow( &p->vWeights, 1000 );
    Vec_FltPush( &p->vWeights, -1 );
    Vec_WecGrow( &p->vPairs, 1000 );
    Vec_WecPushLevel( &p->vPairs );
    // prepare divisors
    Vec_WrdGrow( &p->vDivs, p->nVars + 1000 );
    Vec_WrdFill( &p->vDivs, p->nVars, 0 );
    return p;
}